

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbounds.hpp
# Opt level: O2

void __thiscall
soplex::SPxSolverBase<double>::clearDualBounds
          (SPxSolverBase<double> *this,Status stat,double *upp,double *lw)

{
  double *pdVar1;
  uint uVar2;
  
  uVar2 = stat + D_ON_BOTH;
  if (uVar2 < 0xb) {
    if ((0x81U >> (uVar2 & 0x1f) & 1) == 0) {
      if ((0x104U >> (uVar2 & 0x1f) & 1) == 0) {
        if ((0x410U >> (uVar2 & 0x1f) & 1) == 0) {
          return;
        }
        pdVar1 = (double *)infinity();
        *upp = *pdVar1;
        return;
      }
    }
    else {
      pdVar1 = (double *)infinity();
      *upp = *pdVar1;
    }
    pdVar1 = (double *)infinity();
    *lw = -*pdVar1;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::clearDualBounds(
   typename SPxBasisBase<R>::Desc::Status stat,
   R&                  upp,
   R&                  lw) const
{

   switch(stat)
   {
   case SPxBasisBase<R>::Desc::P_ON_UPPER + SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_FREE :
      upp = R(infinity);
      lw  = R(-infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_UPPER :
   case SPxBasisBase<R>::Desc::D_ON_LOWER :
      upp = R(infinity);
      break;

   case SPxBasisBase<R>::Desc::P_ON_LOWER :
   case SPxBasisBase<R>::Desc::D_ON_UPPER :
      lw  = R(-infinity);
      break;

   default:
      break;
   }
}